

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApplicativeHelper.cpp
# Opt level: O0

uint ApplicativeHelper::getArity(TermList sort)

{
  bool bVar1;
  Term *this;
  uint arity;
  undefined4 in_stack_fffffffffffffff0;
  uint uVar2;
  
  uVar2 = 0;
  while( true ) {
    bVar1 = Kernel::TermList::isArrowSort((TermList *)CONCAT44(uVar2,in_stack_fffffffffffffff0));
    if (!bVar1) break;
    this = Kernel::TermList::term((TermList *)0x840f0b);
    Kernel::Term::nthArgument(this,1);
    uVar2 = uVar2 + 1;
  }
  return uVar2;
}

Assistant:

unsigned ApplicativeHelper::getArity(TermList sort)
{
  unsigned arity = 0;
  while(sort.isArrowSort()){
    sort = *sort.term()->nthArgument(1);
    arity++; 
  }
  return arity;
}